

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_ref_t
flatcc_builder_embed_buffer
          (flatcc_builder_t *B,uint16_t block_align,void *data,size_t size,uint16_t align,
          flatcc_builder_buffer_flags_t flags)

{
  bool bVar1;
  uint uVar2;
  flatcc_builder_ref_t fVar3;
  uint uVar4;
  size_t sVar5;
  bool bVar6;
  flatbuffers_uoffset_t size_field;
  uint16_t align_local;
  flatcc_iov_state_t iov;
  
  align_local = align;
  align_buffer_end(B,&align_local,block_align,(uint)(B->nest_id != 0));
  iov.len = 0;
  uVar2 = align_local - 1 & B->emit_start - ((int)size + (flags & 2) * 2);
  size_field = uVar2 + (int)size;
  bVar6 = B->nest_id == 0;
  if (bVar6) {
    sVar5 = 0;
  }
  else {
    sVar5 = 4;
    iov.len = 4;
    iov.iov[0].iov_base = &size_field;
    iov.iov[0].iov_len = 4;
  }
  bVar1 = !bVar6;
  uVar4 = (uint)bVar1;
  iov.count = (int)!bVar6;
  if (size != 0) {
    sVar5 = sVar5 + size;
    iov.iov[bVar1].iov_base = data;
    iov.iov[bVar1].iov_len = size;
    uVar4 = uVar4 + 1;
    iov.len = sVar5;
    iov.count = uVar4;
  }
  if (uVar2 != 0) {
    iov.len = sVar5 + uVar2;
    *(uint8_t **)((long)&iov.iov[0].iov_base + (ulong)(uVar4 << 4)) = "";
    *(ulong *)((long)&iov.iov[0].iov_len + (ulong)(uVar4 << 4)) = (ulong)uVar2;
    iov.count = uVar4 + 1;
  }
  fVar3 = emit_front(B,&iov);
  return fVar3;
}

Assistant:

flatcc_builder_ref_t flatcc_builder_embed_buffer(flatcc_builder_t *B,
        uint16_t block_align,
        const void *data, size_t size, uint16_t align, flatcc_builder_buffer_flags_t flags)
{
    uoffset_t size_field, pad;
    iov_state_t iov;
    int with_size = (flags & flatcc_builder_with_size) != 0;

    if (align_buffer_end(B, &align, block_align, !is_top_buffer(B))) {
        return 0;
    }
    pad = front_pad(B, (uoffset_t)(size + (with_size ? field_size : 0)), align);
    write_uoffset(&size_field, (uoffset_t)size + pad);
    init_iov();
    /* Add ubyte vector size header if nested buffer. */
    push_iov_cond(&size_field, field_size, !is_top_buffer(B));
    push_iov(data, size);
    push_iov(_pad, pad);
    return emit_front(B, &iov);
}